

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float32_unordered_quiet_mips(float32 a,float32 b,float_status *status)

{
  float32 a_00;
  float32 a_01;
  int iVar1;
  uint32_t uVar2;
  float_status *status_local;
  float32 b_local;
  float32 a_local;
  
  a_00 = float32_squash_input_denormal_mips(a,status);
  a_01 = float32_squash_input_denormal_mips(b,status);
  iVar1 = extractFloat32Exp(a_00);
  if (((iVar1 != 0xff) || (uVar2 = extractFloat32Frac(a_00), uVar2 == 0)) &&
     ((iVar1 = extractFloat32Exp(a_01), iVar1 != 0xff ||
      (uVar2 = extractFloat32Frac(a_01), uVar2 == 0)))) {
    return 0;
  }
  iVar1 = float32_is_signaling_nan_mips(a_00,status);
  if ((iVar1 != 0) || (iVar1 = float32_is_signaling_nan_mips(a_01,status), iVar1 != 0)) {
    float_raise_mips('\x01',status);
  }
  return 1;
}

Assistant:

int float32_unordered_quiet(float32 a, float32 b, float_status *status)
{
    a = float32_squash_input_denormal(a, status);
    b = float32_squash_input_denormal(b, status);

    if (    ( ( extractFloat32Exp( a ) == 0xFF ) && extractFloat32Frac( a ) )
         || ( ( extractFloat32Exp( b ) == 0xFF ) && extractFloat32Frac( b ) )
       ) {
        if (float32_is_signaling_nan(a, status)
         || float32_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 1;
    }
    return 0;
}